

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

void writeToFile(string *str,string *fileName)

{
  ofstream ofs;
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,(string *)fileName,_S_out);
  if ((abStack_1f0[*(long *)(local_210 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::ofstream::close();
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
    return;
  }
  __assert_fail("!ofs.fail()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                ,0x234,"void writeToFile(const std::string &, const std::string &)");
}

Assistant:

void writeToFile( std::string const & str, std::string const & fileName )
{
  std::ofstream ofs( fileName );
  assert( !ofs.fail() );
  ofs << str;
  ofs.close();

#if defined( CLANG_FORMAT_EXECUTABLE )
  // explicitly flush std::cout, as std::system spawns a sub-process
  std::cout.flush();

  messager.message( "VulkanHppGenerator: Formatting " + fileName + " ...\n" );
  const std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" -i --style=file " + fileName;
  const int         ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    throw std::runtime_error( "VulkanHppGenerator: failed to format file " + fileName + " with error <" + std::to_string( ret ) + ">" );
  }
#endif
}